

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.cc
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  UnitTest *this;
  int local_14;
  
  printf("Running main() from %s\n",
         "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/test_main.cc"
        );
  cpu_check_features(&test_cpu_features);
  testing::InitGoogleTest(&local_14,argv);
  this = testing::UnitTest::GetInstance();
  iVar1 = testing::UnitTest::Run(this);
  return iVar1;
}

Assistant:

GTEST_API_ int main(int argc, char **argv) {
  printf("Running main() from %s\n", __FILE__);
#ifndef DISABLE_RUNTIME_CPU_DETECTION
  cpu_check_features(&test_cpu_features);
#endif
  testing::InitGoogleTest(&argc, argv);
  return RUN_ALL_TESTS();
}